

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_long>::test_many<(libdivide::Branching)1>
          (DivideTest<unsigned_long> *this,unsigned_long denom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  unsigned_long uVar3;
  long lVar4;
  divider<unsigned_long,_(libdivide::Branching)1> the_divider;
  string_class local_48;
  
  if (denom != 1) {
    if (denom == 0) {
      fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x44c,"libdivide_internal_u64_gen",
              "divider must be != 0");
      abort();
    }
    if ((denom - 1 & denom) == 0) {
      the_divider.div.denom.magic = 0;
      the_divider.div.denom.more = 0x3e - (byte)LZCOUNT(denom);
    }
    else {
      the_divider.div.denom.more = (byte)LZCOUNT(denom) ^ 0x3f;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = denom;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = 1L << ((ulong)the_divider.div.denom.more & 0x3f);
      lVar4 = SUB168((auVar2 << 0x40) % auVar1,0);
      the_divider.div.denom.magic = (ulong)(lVar4 < 0 || denom <= (ulong)(lVar4 * 2)) + 1;
    }
    uVar3 = libdivide::divider<unsigned_long,_(libdivide::Branching)1>::recover(&the_divider);
    if (uVar3 != denom) {
      std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
      testcase_name_abi_cxx11_(&local_48,this,1);
      std::operator<<((ostream *)&std::cerr,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,denom);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,uVar3);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
    test_edgecase_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_small_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_pow2_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_allbits_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_random_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_vectordivide_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
  }
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }